

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O1

void curlx_dyn_reset(dynbuf *s)

{
  if (s->leng != 0) {
    *s->bufr = '\0';
  }
  s->leng = 0;
  return;
}

Assistant:

void Curl_dyn_reset(struct dynbuf *s)
{
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  if(s->leng)
    s->bufr[0] = 0;
  s->leng = 0;
}